

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

uintwide_t<128U,_unsigned_int,_void,_true> * __thiscall
math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator*=
          (uintwide_t<128U,_unsigned_int,_void,_true> *this,
          uintwide_t<128U,_unsigned_int,_void,_true> *other)

{
  undefined1 local_28 [8];
  uintwide_t<128U,_unsigned_int,_void,_true> other_as_self_copy;
  uintwide_t<128U,_unsigned_int,_void,_true> *other_local;
  uintwide_t<128U,_unsigned_int,_void,_true> *this_local;
  
  other_as_self_copy.values.super_array<unsigned_int,_4UL>.elems._8_8_ = other;
  if (this == other) {
    local_28 = *(undefined1 (*) [8])(other->values).super_array<unsigned_int,_4UL>.elems;
    other_as_self_copy.values.super_array<unsigned_int,_4UL>.elems._0_8_ =
         *(undefined8 *)((other->values).super_array<unsigned_int,_4UL>.elems + 2);
    void_math::wide_integer::uintwide_t<128u,unsigned_int,void,true>::eval_mul_unary<128u>(math::
    wide_integer::uintwide_t<128u,unsigned_int,void,true>&,math::wide_integer::
    uintwide_t<128u,unsigned_int,void,true>const&,std::enable_if<((128u)/std::
    numeric_limits<unsigned_int>::digits)<math::wide_integer::
    uintwide_t<128u,unsigned_int,void,true>::number_of_limbs_karatsuba_threshold,void>::type__
              (this,(uintwide_t<128U,_unsigned_int,_void,_true> *)local_28,
               (enable_if_t<((128U___std::numeric_limits<unsigned_int>::digits)_<_number_of_limbs_karatsuba_threshold)>
                *)0x0);
  }
  else {
    void_math::wide_integer::uintwide_t<128u,unsigned_int,void,true>::eval_mul_unary<128u>(math::
    wide_integer::uintwide_t<128u,unsigned_int,void,true>&,math::wide_integer::
    uintwide_t<128u,unsigned_int,void,true>const&,std::enable_if<((128u)/std::
    numeric_limits<unsigned_int>::digits)<math::wide_integer::
    uintwide_t<128u,unsigned_int,void,true>::number_of_limbs_karatsuba_threshold,void>::type__
              (this,other,
               (enable_if_t<((128U___std::numeric_limits<unsigned_int>::digits)_<_number_of_limbs_karatsuba_threshold)>
                *)0x0);
  }
  return this;
}

Assistant:

constexpr auto operator*=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        const uintwide_t other_as_self_copy(other); // NOLINT(performance-unnecessary-copy-initialization)

        eval_mul_unary(*this, other_as_self_copy);
      }
      else
      {
        eval_mul_unary(*this, other);
      }

      return *this;
    }